

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mailbox_safe.cpp
# Opt level: O2

ssize_t __thiscall
zmq::mailbox_safe_t::recv(mailbox_safe_t *this,int __fd,void *__buf,size_t __n,int __flags)

{
  int __errnum;
  __pid_t _Var1;
  ssize_t sVar2;
  int *piVar3;
  char *errmsg_;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf_00;
  ulong uVar4;
  
  sVar2 = ypipe_t<zmq::command_t,_16>::read(&this->_cpipe,__fd,__buf,__n);
  uVar4 = 0;
  if ((char)sVar2 == '\0') {
    if ((int)__buf == 0) {
      mutex_t::unlock(this->_sync);
      mutex_t::lock(this->_sync);
      __buf_00 = extraout_RDX_00;
    }
    else {
      _Var1 = condition_variable_t::wait(&this->_cond_var,this->_sync);
      __buf_00 = extraout_RDX;
      if (_Var1 == -1) {
        piVar3 = __errno_location();
        __errnum = *piVar3;
        uVar4 = 0xffffffffffffffff;
        if ((__errnum != 4) && (__errnum != 0xb)) {
          errmsg_ = strerror(__errnum);
          fprintf(_stderr,"%s (%s:%d)\n",errmsg_,
                  "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/mailbox_safe.cpp"
                  ,0x6f);
          fflush(_stderr);
          zmq_abort(errmsg_);
        }
        goto LAB_001c1580;
      }
    }
    sVar2 = ypipe_t<zmq::command_t,_16>::read(&this->_cpipe,__fd,__buf_00,__n);
    uVar4 = 0;
    if ((char)sVar2 == '\0') {
      piVar3 = __errno_location();
      *piVar3 = 0xb;
      uVar4 = 0xffffffffffffffff;
    }
  }
LAB_001c1580:
  return uVar4 & 0xffffffff;
}

Assistant:

int zmq::mailbox_safe_t::recv (command_t *cmd_, int timeout_)
{
    //  Try to get the command straight away.
    if (_cpipe.read (cmd_))
        return 0;

    //  If the timeout is zero, it will be quicker to release the lock, giving other a chance to send a command
    //  and immediately relock it.
    if (timeout_ == 0) {
        _sync->unlock ();
        _sync->lock ();
    } else {
        //  Wait for signal from the command sender.
        const int rc = _cond_var.wait (_sync, timeout_);
        if (rc == -1) {
            errno_assert (errno == EAGAIN || errno == EINTR);
            return -1;
        }
    }

    //  Another thread may already fetch the command
    const bool ok = _cpipe.read (cmd_);

    if (!ok) {
        errno = EAGAIN;
        return -1;
    }

    return 0;
}